

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdsDef.cpp
# Opt level: O0

bool operator<(AmsNetId *lhs,AmsNetId *rhs)

{
  uint local_24;
  uint i;
  AmsNetId *rhs_local;
  AmsNetId *lhs_local;
  
  local_24 = 0;
  while( true ) {
    if (5 < local_24) {
      return false;
    }
    if (lhs->b[local_24] != rhs->b[local_24]) break;
    local_24 = local_24 + 1;
  }
  return lhs->b[local_24] < rhs->b[local_24];
}

Assistant:

bool operator<(const AmsNetId& lhs, const AmsNetId& rhs)
{
    for (unsigned int i = 0; i < sizeof(rhs.b); ++i) {
        if (lhs.b[i] != rhs.b[i]) {
            return lhs.b[i] < rhs.b[i];
        }
    }
    return false;
}